

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_52317d::AddAuthorityKeyIdentifier
          (anon_unknown_dwarf_52317d *this,X509_CRL *crl,Span<const_unsigned_char> key_id)

{
  ASN1_STRING *str;
  UniquePtr<AUTHORITY_KEYID> x;
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  ASN1_OCTET_STRING *pAVar4;
  uchar *_data;
  size_t len_s;
  unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter> local_30;
  UniquePtr<AUTHORITY_KEYID> akid;
  X509_CRL *crl_local;
  Span<const_unsigned_char> key_id_local;
  
  key_id_local.data_ = key_id.data_;
  akid._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<AUTHORITY_KEYID_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<AUTHORITY_KEYID_st,_bssl::internal::Deleter,_true,_true>)this;
  crl_local = crl;
  pAVar3 = (pointer)AUTHORITY_KEYID_new();
  std::unique_ptr<AUTHORITY_KEYID_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<AUTHORITY_KEYID_st,bssl::internal::Deleter> *)&local_30,pAVar3);
  bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
  if (bVar1) {
    key_id_local.size_._7_1_ = 0;
  }
  else {
    pAVar4 = ASN1_OCTET_STRING_new();
    pAVar3 = std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::operator->(&local_30);
    pAVar3->keyid = (ASN1_OCTET_STRING *)pAVar4;
    pAVar3 = std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::operator->(&local_30);
    if (pAVar3->keyid != (ASN1_OCTET_STRING *)0x0) {
      pAVar3 = std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::operator->(&local_30);
      str = pAVar3->keyid;
      _data = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&crl_local);
      len_s = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&crl_local);
      iVar2 = ASN1_STRING_set(str,_data,len_s);
      x = akid;
      if (iVar2 != 0) {
        pAVar3 = std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::get(&local_30);
        iVar2 = X509_CRL_add1_ext_i2d
                          ((X509_CRL *)
                           x._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl,0x5a,
                           pAVar3,0,0);
        if (iVar2 != 0) {
          key_id_local.size_._7_1_ = 1;
          goto LAB_00664fbf;
        }
      }
    }
    key_id_local.size_._7_1_ = 0;
  }
LAB_00664fbf:
  std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return (bool)(key_id_local.size_._7_1_ & 1);
}

Assistant:

static bool AddAuthorityKeyIdentifier(X509_CRL *crl,
                                      bssl::Span<const uint8_t> key_id) {
  bssl::UniquePtr<AUTHORITY_KEYID> akid(AUTHORITY_KEYID_new());
  if (akid == nullptr) {
    return false;
  }
  akid->keyid = ASN1_OCTET_STRING_new();
  if (akid->keyid == nullptr ||
      !ASN1_STRING_set(akid->keyid, key_id.data(), key_id.size()) ||
      !X509_CRL_add1_ext_i2d(crl, NID_authority_key_identifier, akid.get(),
                             /*crit=*/0, /*flags=*/0)) {
    return false;
  }
  return true;
}